

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void gl4cts::EnhancedLayouts::Utils::clearPtrVector<gl4cts::EnhancedLayouts::Utils::Interface>
               (vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                *vector)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Interface *this;
  pointer pcVar2;
  pointer ppIVar3;
  pointer ppIVar4;
  ulong uVar5;
  
  ppIVar3 = (vector->
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppIVar4 = (vector->
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar4 != ppIVar3) {
    uVar5 = 0;
    do {
      this = ppIVar3[uVar5];
      ppIVar3[uVar5] = (Interface *)0x0;
      if (this != (Interface *)0x0) {
        pcVar2 = (this->m_name)._M_dataplus._M_p;
        paVar1 = &(this->m_name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        std::
        vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
        ::~vector(&this->m_members);
        operator_delete(this,0x40);
      }
      uVar5 = uVar5 + 1;
      ppIVar3 = (vector->
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppIVar4 = (vector->
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar5 < (ulong)((long)ppIVar4 - (long)ppIVar3 >> 3));
  }
  if (ppIVar4 != ppIVar3) {
    (vector->
    super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppIVar3;
  }
  return;
}

Assistant:

void clearPtrVector(std::vector<T*>& vector)
{
	for (size_t i = 0; i < vector.size(); ++i)
	{
		T* t = vector[i];

		vector[i] = 0;

		if (0 != t)
		{
			delete t;
		}
	}

	vector.clear();
}